

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblecache.cpp
# Opt level: O1

bool __thiscall QAccessibleCache::containsObject(QAccessibleCache *this,QObject *obj)

{
  QMetaObject *pQVar1;
  bool bVar2;
  QMetaObject *pQVar3;
  iterator iVar4;
  iterator iVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QList<std::pair<unsigned_int,_const_QMetaObject_*>_> local_48;
  QObject *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = obj;
  if (obj != (QObject *)0x0) {
    pQVar3 = (QMetaObject *)(*(code *)**(undefined8 **)obj)(obj);
    QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>>::valuesImpl<QObject*>
              (&local_48,
               (QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>> *)(this + 0x20),
               &local_30);
    iVar4 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::begin(&local_48);
    iVar5 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::end(&local_48);
    bVar6 = iVar4.i == iVar5.i;
    if (!bVar6) {
      pQVar1 = (iVar4.i)->second;
      while (pQVar1 != pQVar3) {
        bVar6 = iVar4.i + 1 == iVar5.i;
        if (bVar6) break;
        pQVar1 = iVar4.i[1].second;
        iVar4.i = iVar4.i + 1;
      }
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,0x10,0x10);
      }
    }
    bVar2 = true;
    if (!bVar6) goto LAB_0059472d;
  }
  bVar2 = false;
LAB_0059472d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QAccessibleCache::containsObject(QObject *obj) const
{
    if (obj) {
        const QMetaObject *mo = obj->metaObject();
        for (auto pair : objectToId.values(obj)) {
            if (pair.second == mo) {
                return true;
            }
        }
    }
    return false;
}